

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteBeginBlock
          (WatWriter *this,LabelType label_type,Block *block,char *text)

{
  pointer *ppLVar1;
  TypeVector *types;
  size_type sVar2;
  Label *__last;
  pointer __first;
  ulong uVar3;
  pointer __result;
  pointer pLVar4;
  ulong uVar5;
  _Tp_alloc_type *__alloc;
  char *__n;
  _Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
  *this_00;
  long lVar6;
  
  WritePuts(this,text,Space);
  sVar2 = (block->label)._M_string_length;
  if (sVar2 != 0) {
    WritePuts(this,(block->label)._M_dataplus._M_p,Space);
  }
  __alloc = (_Tp_alloc_type *)&(block->decl).sig;
  WriteTypes(this,(TypeVector *)__alloc,"param");
  types = &(block->decl).sig.result_types;
  __n = (char *)types;
  WriteTypes(this,types,"result");
  if (sVar2 == 0) {
    __n = " ;; label = @%u";
    Writef(this," ;; label = @%u",
           (ulong)(uint)((int)((ulong)((long)(this->label_stack_).
                                             super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->label_stack_).
                                            super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x45d1745d));
  }
  if (this->next_char_ == ForceNewline) {
    WriteNextChar(this);
  }
  this->next_char_ = ForceNewline;
  __last = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__last == (this->label_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = (this->label_stack_).
              super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)__last - (long)__first;
    if (lVar6 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar5 = (lVar6 >> 3) * 0x2e8ba2e8ba2e8ba3;
    uVar3 = 1;
    if (__last != __first) {
      uVar3 = uVar5;
    }
    this_00 = (_Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
               *)(uVar3 + uVar5);
    if ((_Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
         *)0x1745d1745d1745c < this_00) {
      this_00 = (_Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                 *)0x1745d1745d1745d;
    }
    if (CARRY8(uVar3,uVar5)) {
      this_00 = (_Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                 *)0x1745d1745d1745d;
    }
    __result = std::
               _Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
               ::_M_allocate(this_00,(size_t)__n);
    Label::Label((Label *)(lVar6 + (long)__result),label_type,&block->label,(TypeVector *)__alloc,
                 types);
    pLVar4 = std::
             vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ::_S_relocate(__first,__last,__result,__alloc);
    if (__first != (pointer)0x0) {
      operator_delete(__first);
    }
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar4 + 1;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
  }
  else {
    Label::Label(__last,label_type,&block->label,(TypeVector *)__alloc,types);
    ppLVar1 = &(this->label_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppLVar1 = *ppLVar1 + 1;
  }
  this->indent_ = this->indent_ + 2;
  return;
}

Assistant:

void WatWriter::WriteBeginBlock(LabelType label_type,
                                const Block& block,
                                const char* text) {
  WritePutsSpace(text);
  bool has_label = !block.label.empty();
  if (has_label) {
    WriteString(block.label, NextChar::Space);
  }
  WriteTypes(block.decl.sig.param_types, "param");
  WriteTypes(block.decl.sig.result_types, "result");
  if (!has_label) {
    Writef(" ;; label = @%" PRIindex, GetLabelStackSize());
  }
  WriteNewline(FORCE_NEWLINE);
  label_stack_.emplace_back(label_type, block.label, block.decl.sig.param_types,
                            block.decl.sig.result_types);
  Indent();
}